

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::layoutChanged(QAbstractItemModelTesterPrivate *this)

{
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  pointer pQVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QObject *local_a0;
  long local_90;
  QModelIndex local_88;
  undefined1 local_70 [24];
  QModelIndex local_58;
  QPersistentModelIndex p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.r = 4;
  bVar3 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)&local_58,"changeInFlight",
                     "ChangeInFlight::LayoutChanged",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x393);
  if (bVar3) {
    this->changeInFlight = None;
    uVar7 = 0xffffffffffffffff;
    local_90 = 0;
    do {
      uVar7 = uVar7 + 1;
      if ((ulong)(this->changing).d.size <= uVar7) {
        QList<QPersistentModelIndex>::clear(&this->changing);
        break;
      }
      p.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = QList<QPersistentModelIndex>::data(&this->changing);
      QPersistentModelIndex::QPersistentModelIndex
                (&p,(QPersistentModelIndex *)((long)&pQVar6->d + local_90));
      pDVar2 = (this->model).wp.d;
      if ((pDVar2 == (Data *)0x0) ||
         ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        local_a0 = (QObject *)0x0;
      }
      else {
        local_a0 = (this->model).wp.value;
      }
      uVar4 = QPersistentModelIndex::row();
      uVar5 = QPersistentModelIndex::column();
      QPersistentModelIndex::parent();
      (**(code **)(*(long *)local_a0 + 0x60))(&local_58,local_a0,uVar4,uVar5,local_70);
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&p);
      bVar3 = compare<QModelIndex,QModelIndex>
                        (this,&local_58,&local_88,"model->index(p.row(), p.column(), p.parent())",
                         "QModelIndex(p)",
                         "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                         ,0x398);
      local_90 = local_90 + 8;
      QPersistentModelIndex::~QPersistentModelIndex(&p);
    } while (bVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::layoutChanged()
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::LayoutChanged);
    changeInFlight = ChangeInFlight::None;

    for (int i = 0; i < changing.size(); ++i) {
        QPersistentModelIndex p = changing[i];
        MODELTESTER_COMPARE(model->index(p.row(), p.column(), p.parent()), QModelIndex(p));
    }
    changing.clear();
}